

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  ~FastWriter(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~FastWriter() {}